

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

string * __thiscall leveldb::Slice::ToString_abi_cxx11_(Slice *this)

{
  size_type *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *__a;
  size_type __n;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = *in_RSI;
  __s = (char *)in_RSI[1];
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffff7;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,__s,__n,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString() const { return std::string(data_, size_); }